

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O3

void __thiscall MainWindow::showHistory(MainWindow *this)

{
  PersistantDialog *pPVar1;
  QVBoxLayout *this_00;
  QUndoView *this_01;
  QUndoGroup *pQVar2;
  QArrayData *local_30 [3];
  
  if (this->mHistoryDialog == (PersistantDialog *)0x0) {
    pPVar1 = (PersistantDialog *)operator_new(0x30);
    PersistantDialog::PersistantDialog(pPVar1,(QWidget *)this,(WindowFlags)0x8003000);
    this->mHistoryDialog = pPVar1;
    this_00 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout(this_00);
    this_01 = (QUndoView *)operator_new(0x28);
    pQVar2 = Module::undoGroup(this->mModule);
    QUndoView::QUndoView(this_01,pQVar2,(QWidget *)0x0);
    QBoxLayout::addWidget(this_00,this_01,0,0);
    QWidget::setLayout((QLayout *)this->mHistoryDialog);
    pPVar1 = this->mHistoryDialog;
    QMetaObject::tr((char *)local_30,(char *)&staticMetaObject,0x1b4c9a);
    QWidget::setWindowTitle((QString *)pPVar1);
    if (local_30[0] != (QArrayData *)0x0) {
      LOCK();
      (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30[0],2,8);
      }
    }
  }
  QWidget::show();
  return;
}

Assistant:

void MainWindow::showHistory() {
    if (mHistoryDialog == nullptr) {
        mHistoryDialog = new PersistantDialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
        auto layout = new QVBoxLayout;
        auto undoView = new QUndoView(mModule->undoGroup());
        layout->addWidget(undoView);
        mHistoryDialog->setLayout(layout);
        mHistoryDialog->setWindowTitle(tr("History"));
    } 
    mHistoryDialog->show();
    
}